

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<float>::Decompose_Cholesky
          (TPZMatrix<float> *this,list<long,_std::allocator<long>_> *singular)

{
  list<long,_std::allocator<long>_> *plVar1;
  list<long,_std::allocator<long>_> *plVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined4 extraout_var;
  TPZBaseMatrix *in_RDI;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float a;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  double __x;
  double dVar7;
  double dVar8;
  double __x_00;
  float tmp2;
  int64_t k_1;
  int64_t j;
  float tmp;
  int64_t k;
  int64_t i;
  int64_t dim;
  char *in_stack_00000128;
  char *in_stack_00000130;
  undefined4 in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  list<long,_std::allocator<long>_> *in_stack_ffffffffffffff40;
  undefined1 local_60 [4];
  float local_5c [2];
  float local_54;
  long local_50;
  list<long,_std::allocator<long>_> *local_48;
  undefined4 local_3c;
  undefined4 local_38;
  float local_34;
  long local_30;
  list<long,_std::allocator<long>_> *local_28;
  long local_20;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x03')) {
    Error(in_stack_00000130,in_stack_00000128);
  }
  if (in_RDI->fDecomposed == '\0') {
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar5 != iVar6) {
      Error(in_stack_00000130,in_stack_00000128);
    }
    iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_20 = CONCAT44(extraout_var,iVar4);
    for (local_28 = (list<long,_std::allocator<long>_> *)0x0; (long)local_28 < local_20;
        local_28 = (list<long,_std::allocator<long>_> *)
                   ((long)&(local_28->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node
                           .super__List_node_base._M_next + 1)) {
      for (local_30 = 0; plVar1 = local_28, local_30 < (long)local_28; local_30 = local_30 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_30);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_30);
        local_34 = -extraout_XMM0_Da_00 * extraout_XMM0_Da_01 + extraout_XMM0_Da;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,plVar1,plVar1,&local_34);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
      dVar7 = std::fabs(__x);
      dVar8 = std::fabs(3.60985931757712e-315);
      if (SUB84(dVar7,0) <= SUB84(dVar8,0)) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  (in_stack_ffffffffffffff40,
                   (value_type_conflict5 *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        local_38 = 0x3f800000;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_28,local_28,&local_38);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
      dVar7 = std::sqrt(__x_00);
      local_3c = SUB84(dVar7,0);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_28,local_28,&local_3c);
      local_48 = local_28;
      while (local_48 = (list<long,_std::allocator<long>_> *)
                        ((long)&(local_48->super__List_base<long,_std::allocator<long>_>)._M_impl.
                                _M_node.super__List_node_base._M_next + 1),
            (long)local_48 < local_20) {
        for (local_50 = 0; plVar2 = local_28, plVar1 = local_48, local_50 < (long)local_28;
            local_50 = local_50 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_48);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_50);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_50,local_48);
          local_54 = -extraout_XMM0_Da_03 * extraout_XMM0_Da_04 + extraout_XMM0_Da_02;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,plVar2,plVar1,&local_54);
        }
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
        bVar3 = IsZero(a);
        if (bVar3) {
          Error(in_stack_00000130,in_stack_00000128);
        }
        plVar2 = local_28;
        plVar1 = local_48;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_48);
        in_stack_ffffffffffffff3c = extraout_XMM0_Da_05;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
        local_5c[0] = in_stack_ffffffffffffff3c / extraout_XMM0_Da_06;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,plVar2,plVar1,local_5c);
        plVar1 = local_28;
        in_stack_ffffffffffffff40 = local_48;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_48);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_ffffffffffffff40,plVar1,local_60);
      }
    }
    in_RDI->fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}